

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13_array_object.cpp
# Opt level: O2

double output_array(array<double,_4UL> s)

{
  ostream *poVar1;
  int i;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&SEASONS_abi_cxx11_);
  std::operator<<(poVar1," : ");
}

Assistant:

double output_array(std::array<double, SEASON_COUNT> s) {
    double total = 0;
    for(int i = 0; i < SEASON_COUNT; i++) {
        std::cout << SEASONS[i] << " : " << s[i] << std::endl;
        total += s[i];
    }
    std::cout << "Total spend: " << total << std::endl;
    return total;
}